

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O1

int __thiscall GameBoard::transfer(GameBoard *this)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  int *piVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  
  iVar8 = this->transCount[0];
  if (this->transCount[1] == 0 && iVar8 == 0) {
    return -1;
  }
  iVar1 = this->transCount[1];
  if (iVar8 == 0) {
    if (iVar1 < 1) {
      uVar3 = 1;
      lVar4 = 0;
      goto LAB_00117363;
    }
  }
  else {
    if (iVar1 != 0) {
      iVar12 = this->maxHeight[0];
      iVar7 = iVar12 + iVar1;
      this->maxHeight[0] = iVar7;
      iVar8 = iVar8 + this->maxHeight[1];
      this->maxHeight[1] = iVar8;
      if (0x14 < iVar7) {
        return 0;
      }
      if (iVar8 < 0x15) {
        uVar3 = this->transCount[0];
        if ((int)uVar3 < iVar8) {
          lVar4 = (long)iVar8;
          piVar6 = this->gridInfo[1][lVar4] + 1;
          do {
            lVar11 = 0;
            do {
              piVar6[lVar11] = (piVar6 + lVar11)[(long)this->transCount[0] * -0xc];
              lVar11 = lVar11 + 1;
            } while (lVar11 != 10);
            lVar4 = lVar4 + -1;
            uVar3 = this->transCount[0];
            piVar6 = piVar6 + -0xc;
          } while ((int)uVar3 < lVar4);
        }
        if (0 < (int)uVar3) {
          piVar6 = this->trans[-1][(ulong)uVar3 + 3] + 1;
          uVar5 = (ulong)uVar3;
          do {
            lVar4 = 0;
            do {
              piVar6[lVar4 + -0xfc] = piVar6[lVar4];
              lVar4 = lVar4 + 1;
            } while (lVar4 != 10);
            piVar6 = piVar6 + -0xc;
            bVar2 = 1 < (long)uVar5;
            uVar5 = uVar5 - 1;
          } while (bVar2);
        }
        uVar3 = this->transCount[1];
        if ((int)uVar3 < iVar7) {
          lVar4 = (long)iVar1 + (long)iVar12;
          piVar6 = this->gridInfo[0][(long)iVar12 + (long)iVar1] + 1;
          do {
            lVar11 = 0;
            do {
              piVar6[lVar11] = (piVar6 + lVar11)[(long)this->transCount[1] * -0xc];
              lVar11 = lVar11 + 1;
            } while (lVar11 != 10);
            lVar4 = lVar4 + -1;
            uVar3 = this->transCount[1];
            piVar6 = piVar6 + -0xc;
          } while ((int)uVar3 < lVar4);
        }
        if ((int)uVar3 < 1) {
          return -1;
        }
        piVar6 = this->trans[0][(ulong)uVar3 + 3] + 1;
        uVar5 = (ulong)uVar3;
        do {
          lVar4 = 0;
          do {
            piVar6[lVar4 + -0x234] = piVar6[lVar4];
            lVar4 = lVar4 + 1;
          } while (lVar4 != 10);
          piVar6 = piVar6 + -0xc;
          bVar2 = 1 < (long)uVar5;
          uVar5 = uVar5 - 1;
        } while (bVar2);
        return -1;
      }
      return 1;
    }
    lVar4 = 0;
    uVar3 = 1;
    if ((iVar8 != 0) || (this->transCount[1] < 1)) goto LAB_00117363;
  }
  uVar3 = 0;
  lVar4 = 1;
LAB_00117363:
  iVar8 = this->maxHeight[uVar3];
  iVar1 = this->transCount[lVar4];
  iVar12 = iVar1 + iVar8;
  this->maxHeight[uVar3] = iVar12;
  if (iVar12 < 0x15) {
    uVar9 = this->transCount[lVar4];
    if ((int)uVar9 < iVar12) {
      lVar11 = (long)iVar8 + (long)iVar1;
      piVar6 = this->gridInfo[uVar3][(long)iVar1 + (long)iVar8] + 1;
      do {
        lVar10 = 0;
        do {
          piVar6[lVar10] = (piVar6 + lVar10)[(long)this->transCount[lVar4] * -0xc];
          lVar10 = lVar10 + 1;
        } while (lVar10 != 10);
        lVar11 = lVar11 + -1;
        uVar9 = this->transCount[lVar4];
        piVar6 = piVar6 + -0xc;
      } while ((int)uVar9 < lVar11);
    }
    if (0 < (int)uVar9) {
      uVar5 = (ulong)uVar9;
      lVar4 = (long)this->trans[-1][uVar5 + 3] + (ulong)(uint)((int)lVar4 * 0xc0) + 4;
      piVar6 = this->gridInfo[uVar3][uVar5] + 1;
      do {
        lVar11 = 0;
        do {
          piVar6[lVar11] = *(int *)(lVar4 + lVar11 * 4);
          lVar11 = lVar11 + 1;
        } while (lVar11 != 10);
        lVar4 = lVar4 + -0x30;
        piVar6 = piVar6 + -0xc;
        bVar2 = 1 < (long)uVar5;
        uVar5 = uVar5 - 1;
      } while (bVar2);
    }
    return -1;
  }
  return uVar3;
}

Assistant:

int GameBoard::transfer()
{
    int color1 = 0, color2 = 1;
    if (transCount[color1] == 0 && transCount[color2] == 0)
        return -1;
    if (transCount[color1] == 0 || transCount[color2] == 0) {
        if (transCount[color1] == 0 && transCount[color2] > 0)
            swap(color1, color2);
        int h2;
        maxHeight[color2] = h2 = maxHeight[color2] + transCount[color1];
        if (h2 > MAPHEIGHT)
            return color2;
        int i, j;

        for (i = h2; i > transCount[color1]; i--)
            for (j = 1; j <= MAPWIDTH; j++)
                gridInfo[color2][i][j] = gridInfo[color2][i - transCount[color1]][j];

        for (i = transCount[color1]; i > 0; i--)
            for (j = 1; j <= MAPWIDTH; j++)
                gridInfo[color2][i][j] = trans[color1][i - 1][j];
        return -1;
    }
    else {
        int h1, h2;
        maxHeight[color1] = h1 = maxHeight[color1] + transCount[color2];//从color1处移动count1去color2
        maxHeight[color2] = h2 = maxHeight[color2] + transCount[color1];

        if (h1 > MAPHEIGHT)
            return color1;
        if (h2 > MAPHEIGHT)
            return color2;

        int i, j;
        for (i = h2; i > transCount[color1]; i--)
            for (j = 1; j <= MAPWIDTH; j++)
                gridInfo[color2][i][j] = gridInfo[color2][i - transCount[color1]][j];

        for (i = transCount[color1]; i > 0; i--)
            for (j = 1; j <= MAPWIDTH; j++)
                gridInfo[color2][i][j] = trans[color1][i - 1][j];

        for (i = h1; i > transCount[color2]; i--)
            for (j = 1; j <= MAPWIDTH; j++)
                gridInfo[color1][i][j] = gridInfo[color1][i - transCount[color2]][j];

        for (i = transCount[color2]; i > 0; i--)
            for (j = 1; j <= MAPWIDTH; j++)
                gridInfo[color1][i][j] = trans[color2][i - 1][j];

        return -1;
    }
}